

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content-parser.c
# Opt level: O1

char * blogc_fix_description(char *paragraph)

{
  char cVar1;
  bool bVar2;
  bc_string_t *str;
  long lVar3;
  char *pcVar4;
  char *suffix;
  bool bVar5;
  long lVar6;
  
  if (paragraph == (char *)0x0) {
    return (char *)0x0;
  }
  bVar2 = false;
  str = bc_string_new();
  bVar5 = false;
  lVar3 = 0;
  lVar6 = 0;
  do {
    cVar1 = paragraph[lVar6];
    if ((cVar1 == '\r') || (cVar1 == '\n')) {
LAB_001063c1:
      if (!bVar5) {
        pcVar4 = bc_strndup(paragraph + lVar3,lVar6 - lVar3);
        suffix = bc_str_strip(pcVar4);
        bc_string_append(str,suffix);
        free(pcVar4);
        if (!bVar2) {
          bc_string_append_c(str,' ');
        }
        lVar3 = lVar6 + 1;
        bVar5 = true;
      }
    }
    else {
      if (cVar1 == '\0') {
        bVar2 = true;
        goto LAB_001063c1;
      }
      bVar5 = false;
    }
    lVar6 = lVar6 + 1;
    if (bVar2) {
      pcVar4 = bc_str_strip(str->str);
      pcVar4 = blogc_htmlentities(pcVar4);
      bc_string_free(str,true);
      return pcVar4;
    }
  } while( true );
}

Assistant:

char*
blogc_fix_description(const char *paragraph)
{
    if (paragraph == NULL)
        return NULL;
    bc_string_t *rv = bc_string_new();
    bool last = false;
    bool newline = false;
    char *tmp = NULL;
    size_t start = 0;
    size_t current = 0;
    while (true) {
        switch (paragraph[current]) {
            case '\0':
                last = true;
            case '\r':
            case '\n':
                if (newline)
                    break;
                tmp = bc_strndup(paragraph + start, current - start);
                bc_string_append(rv, bc_str_strip(tmp));
                free(tmp);
                tmp = NULL;
                if (!last)
                    bc_string_append_c(rv, ' ');
                start = current + 1;
                newline = true;
                break;
            default:
                newline = false;
        }
        if (last)
            break;
        current++;
    }
    tmp = blogc_htmlentities(bc_str_strip(rv->str));
    bc_string_free(rv, true);
    return tmp;
}